

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.cpp
# Opt level: O0

void amrex::Warning_host(char *msg)

{
  Print *x;
  long in_RDI;
  char **in_stack_fffffffffffffe48;
  Print *this;
  ostream *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe7c;
  Print *in_stack_fffffffffffffe80;
  Print *in_stack_fffffffffffffec0;
  
  if (in_RDI != 0) {
    ErrorStream();
    this = (Print *)&stack0xfffffffffffffe70;
    Print::Print(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe70);
    Print::operator<<(this,in_stack_fffffffffffffe48);
    x = Print::operator<<(this,(char *)in_stack_fffffffffffffe48);
    Print::operator<<(this,(char *)x);
    Print::~Print(in_stack_fffffffffffffec0);
  }
  return;
}

Assistant:

void
amrex::Warning_host (const char * msg)
{
    if (msg) {
        amrex::Print(Print::AllProcs,amrex::ErrorStream()) << msg << '!' << '\n';
    }
}